

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDDOMParser::endElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,uint param_2,bool param_3,XMLCh *param_4)

{
  DOMDocumentImpl *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMNode *local_38;
  XMLCh *param_4_local;
  bool param_3_local;
  uint param_2_local;
  XMLElementDecl *elemDecl_local;
  XSDDOMParser *this_local;
  
  if (-1 < this->fAnnotationDepth) {
    if (this->fInnerAnnotationDepth == this->fDepth) {
      this->fInnerAnnotationDepth = -1;
      endAnnotationElement(this,elemDecl,false);
    }
    else {
      if (this->fAnnotationDepth != this->fDepth) {
        endAnnotationElement(this,elemDecl,false);
        this->fDepth = this->fDepth + -1;
        return;
      }
      this->fAnnotationDepth = -1;
      endAnnotationElement(this,elemDecl,true);
    }
  }
  this->fDepth = this->fDepth + -1;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode =
       (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent;
  iVar2 = (*((this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode)->_vptr_DOMNode[5])
                    ();
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent =
       (DOMNode *)CONCAT44(extraout_var,iVar2);
  pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
  local_38 = (DOMNode *)0x0;
  if (pDVar1 != (DOMDocumentImpl *)0x0) {
    local_38 = &(pDVar1->super_DOMDocument).super_DOMNode;
  }
  if ((this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent == local_38) {
    (this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement = false;
  }
  return;
}

Assistant:

void XSDDOMParser::endElement( const XMLElementDecl& elemDecl
                             , const unsigned int
                             , const bool
                             , const XMLCh* const)
{
    if(fAnnotationDepth > -1)
    {
        if (fInnerAnnotationDepth == fDepth)
        {
            fInnerAnnotationDepth = -1;
            endAnnotationElement(elemDecl, false);
	    }
        else if (fAnnotationDepth == fDepth)
        {
            fAnnotationDepth = -1;
            endAnnotationElement(elemDecl, true);
        }
        else
        {   // inside a child of annotation
            endAnnotationElement(elemDecl, false);
            fDepth--;
            return;
        }
    }

    fDepth--;
    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // If we've hit the end of content, clear the flag.
    //
    if (fCurrentParent == fDocument)
        fWithinElement = false;
}